

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

Node * __thiscall
sjtu::map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>::
search(map<long,_sjtu::LRUCache<std::pair<sjtu::orderType,_long>_>::CacheNode_*,_std::less<long>_>
       *this,long *key)

{
  Node *pNVar1;
  long lVar2;
  
  pNVar1 = this->nil;
  while( true ) {
    pNVar1 = pNVar1->left;
    if ((pNVar1 == this->nil) || (lVar2 = pNVar1->value->first, lVar2 == *key)) break;
    pNVar1 = (Node *)(&pNVar1->value + (lVar2 <= *key));
  }
  return pNVar1;
}

Assistant:

Node *search(const Key &key) const
	{
		Node *x = nil -> left;
		for (;x != nil && (compare(key , x -> value -> first) || compare(x -> value -> first , key));x = compare(key , x -> value -> first) ? x -> left : x -> right);
		return x;
	}